

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O2

void __thiscall deci::program_t::Evaluate(program_t *this,vm_t *vm,stack_t *stack,stack_t *local)

{
  pointer pcVar1;
  double dVar2;
  pointer pcVar3;
  pointer pcVar4;
  ulong uVar5;
  value_t *pvVar6;
  value_t *pvVar7;
  value_t *pvVar8;
  long lVar9;
  ulong uVar10;
  runtime_error *this_00;
  int iVar11;
  value_type command;
  
  pcVar3 = (this->source).super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pcVar4 = (this->source).super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
LAB_001074ff:
  if ((ulong)((long)pcVar3 - (long)pcVar4 >> 4) <= uVar10) {
    return;
  }
  pcVar1 = (this->source).super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar10;
  command._0_8_ = *(undefined8 *)pcVar1;
  pvVar8 = pcVar1->arg;
  command.arg = pvVar8;
  switch(command._0_8_ & 0xffffffff) {
  case 0:
    break;
  case 1:
    uVar5 = (ulong)(double)pvVar8[1]._vptr_value_t;
    pvVar8 = stack_t::Top(stack,(long)((double)pvVar8[1]._vptr_value_t - 9.223372036854776e+18) &
                                (long)uVar5 >> 0x3f | uVar5);
    goto LAB_00107797;
  case 2:
    goto LAB_00107797;
  case 3:
    goto switchD_00107533_caseD_3;
  case 4:
    iVar11 = (int)(double)pvVar8[1]._vptr_value_t;
    goto LAB_00107738;
  case 5:
    (*this->result->_vptr_value_t[3])();
    pvVar8 = EvaluateCALL(&command,vm,local);
    this->result = pvVar8;
    break;
  case 6:
    pvVar8 = stack_t::Top(local,0);
    stack_t::Result(local,pvVar8);
    break;
  case 7:
    (*this->result->_vptr_value_t[3])();
    pvVar8 = EvaluateCALL(&command,vm,local);
    this->result = pvVar8;
    iVar11 = 2;
    goto LAB_00107789;
  case 8:
    pvVar6 = stack_t::Variable(local,pvVar8);
    pvVar7 = nothing_t::Instance();
    if (pvVar6 == pvVar7) {
      pvVar6 = stack_t::Variable(stack,pvVar8);
      pvVar8 = nothing_t::Instance();
      if (pvVar6 == pvVar8) {
        pvVar6 = nothing_t::Instance();
      }
    }
    stack_t::Push(local,pvVar6);
    uVar10 = uVar10 + 1;
    goto LAB_001074ff;
  case 9:
    pvVar6 = stack_t::Top(local,0);
    stack_t::Variable(local,pvVar8,pvVar6);
    iVar11 = 1;
LAB_00107738:
    stack_t::Drop(local,iVar11);
    break;
  case 10:
    (*this->result->_vptr_value_t[3])();
    pvVar8 = EvaluateCALL(&command,vm,local);
    this->result = pvVar8;
    iVar11 = 1;
LAB_00107789:
    stack_t::Drop(local,iVar11);
switchD_00107533_caseD_3:
    pvVar8 = this->result;
LAB_00107797:
    stack_t::Push(local,pvVar8);
    break;
  case 0xb:
    pvVar8 = stack_t::Top(local,0);
    lVar9 = __dynamic_cast(pvVar8,&value_t::typeinfo,&number_t::typeinfo,0);
    if (lVar9 == 0) goto LAB_001077ca;
    dVar2 = *(double *)(lVar9 + 0x10);
    stack_t::Drop(local,1);
    if ((dVar2 == 0.0) && (!NAN(dVar2))) goto switchD_00107533_caseD_c;
    break;
  case 0xc:
switchD_00107533_caseD_c:
    lVar9 = __dynamic_cast(command.arg,&value_t::typeinfo,&number_t::typeinfo,0);
    if (lVar9 == 0) {
LAB_001077ca:
      __cxa_bad_cast();
    }
    uVar10 = (ulong)*(double *)(lVar9 + 0x10);
    uVar10 = (long)(*(double *)(lVar9 + 0x10) - 9.223372036854776e+18) & (long)uVar10 >> 0x3f |
             uVar10;
    goto LAB_001074ff;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown Operation Code");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0xe:
    pvVar8 = stack_t::Top(local,0);
    lVar9 = __dynamic_cast(pvVar8,&value_t::typeinfo,&number_t::typeinfo,0);
    if (lVar9 == 0) goto LAB_001077ca;
    dVar2 = *(double *)(lVar9 + 0x10);
    stack_t::Drop(local,1);
    if ((dVar2 != 0.0) || (NAN(dVar2))) goto switchD_00107533_caseD_c;
  }
  uVar10 = uVar10 + 1;
  goto LAB_001074ff;
}

Assistant:

void program_t::Evaluate(vm_t& vm, const stack_t& stack, stack_t& local) {
    size_t pc;
    size_t total = this->source.size();

#define NEXT_PC() ++pc; break
#define JUMP_PC(NPC) pc = NPC; break

    for (pc = 0; pc < total;) {
      auto command = this->source[pc];

      switch (command.opcode) {
      case OP_NOP:
        NEXT_PC();
      case OP_ARG:
      {
        number_t& num = *static_cast<number_t*>(command.arg);
        local.Push(stack.Top(static_cast<size_t>(num.Value())));
        NEXT_PC();
      }
      case OP_PUSH:
        local.Push(*command.arg);
        NEXT_PC();
      case OP_DROP:
      {
        number_t& num = *static_cast<number_t*>(command.arg);
        local.Drop(static_cast<int>(num.Value()));
        NEXT_PC();
      }
      case OP_CALL:
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        NEXT_PC();
      case OP_RESULT:
        local.Push(*this->result);
        NEXT_PC();
      case OP_RETURN:
        local.Result(local.Top(0));
        NEXT_PC();
      case OP_BIN:
      {
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        local.Drop(2);
        local.Push(*this->result);
        NEXT_PC();
      }
      case OP_RVAL:
      {
        const value_t& loc_value = local.Variable(*command.arg);       
        if (&loc_value != &nothing_t::Instance()) {
          local.Push(loc_value);
          NEXT_PC();
        }
        const value_t& glob_value = stack.Variable(*command.arg);
        if (&glob_value != &nothing_t::Instance()) {
          local.Push(glob_value);
          NEXT_PC();
        }
        local.Push(nothing_t::Instance());
        NEXT_PC();
      }
      case OP_SET:
      {
        local.Variable(*command.arg, local.Top(0));
        local.Drop(1);
        NEXT_PC();
      }
      case OP_UNR:
      {
        this->result->Delete();
        this->result = EvaluateCALL(command, vm, local);
        local.Drop(1);
        local.Push(*this->result);
        NEXT_PC();
      }
      case OP_JZ:
      {
        double topVal = dynamic_cast<number_t&>(local.Top(0)).Value();
        local.Drop(1);
        if (topVal == 0.0) {
          JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
        }
        NEXT_PC();
      }
      case OP_JMP:
      {
        JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
      }
      case OP_JNZ:
      {
        double topVal = dynamic_cast<number_t&>(local.Top(0)).Value();
        local.Drop(1);
        if (topVal != 0.0) {
          JUMP_PC(dynamic_cast<number_t&>(*command.arg).Value());
        }
        NEXT_PC();
      }
      default:
        throw std::runtime_error("Unknown Operation Code");
      }
    }
  }